

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles31::Functional::anon_unknown_1::InvariantOuterTriangleSetCase::
IsTriangleTriangleOnOuterEdge::operator()(IsTriangleTriangleOnOuterEdge *this,Vec3 *vertices)

{
  float fVar1;
  float *pfVar2;
  bool local_59;
  Vector<float,_3> local_4c;
  Vector<float,_3> local_40;
  undefined1 local_34 [8];
  Vec3 avg;
  int v;
  bool touchesAppropriateEdge;
  Vec3 *vertices_local;
  IsTriangleTriangleOnOuterEdge *this_local;
  
  avg.m_data[2]._3_1_ = 0;
  for (avg.m_data[1] = 0.0; (int)avg.m_data[1] < 3; avg.m_data[1] = (float)((int)avg.m_data[1] + 1))
  {
    pfVar2 = tcu::Vector<float,_3>::operator[](vertices + (int)avg.m_data[1],this->m_edgeNdx);
    if ((*pfVar2 == 0.0) && (!NAN(*pfVar2))) {
      avg.m_data[2]._3_1_ = 1;
    }
  }
  if ((avg.m_data[2]._3_1_ & 1) == 0) {
    this_local._7_1_ = false;
  }
  else {
    tcu::operator+((tcu *)&local_4c,vertices,vertices + 1);
    tcu::operator+((tcu *)&local_40,&local_4c,vertices + 2);
    tcu::operator/((tcu *)local_34,&local_40,3.0);
    pfVar2 = tcu::Vector<float,_3>::operator[]((Vector<float,_3> *)local_34,this->m_edgeNdx);
    fVar1 = *pfVar2;
    pfVar2 = tcu::Vector<float,_3>::operator[]
                       ((Vector<float,_3> *)local_34,(this->m_edgeNdx + 1) % 3);
    local_59 = false;
    if (fVar1 < *pfVar2) {
      pfVar2 = tcu::Vector<float,_3>::operator[]((Vector<float,_3> *)local_34,this->m_edgeNdx);
      fVar1 = *pfVar2;
      pfVar2 = tcu::Vector<float,_3>::operator[]
                         ((Vector<float,_3> *)local_34,(this->m_edgeNdx + 2) % 3);
      local_59 = fVar1 < *pfVar2;
    }
    this_local._7_1_ = local_59;
  }
  return this_local._7_1_;
}

Assistant:

bool operator() (const Vec3* vertices) const
		{
			bool touchesAppropriateEdge = false;
			for (int v = 0; v < 3; v++)
				if (vertices[v][m_edgeNdx] == 0.0f)
					touchesAppropriateEdge = true;

			if (touchesAppropriateEdge)
			{
				const Vec3 avg = (vertices[0] + vertices[1] + vertices[2]) / 3.0f;
				return avg[m_edgeNdx] < avg[(m_edgeNdx+1)%3] &&
					   avg[m_edgeNdx] < avg[(m_edgeNdx+2)%3];
			}
			return false;
		}